

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xpath_count(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *UNUSED_cur_node,
               lys_module *UNUSED_local_mod,lyxp_set *set,int UNUSED_options)

{
  char *pcVar1;
  longdouble lVar2;
  
  switch((*args)->type) {
  case LYXP_SET_EMPTY:
    if ((set->type | LYXP_SET_NUMBER) == LYXP_SET_STRING) {
      free((set->val).nodes);
    }
    set->type = LYXP_SET_NUMBER;
    lVar2 = (longdouble)0;
    goto LAB_0016e9f0;
  case LYXP_SET_NODE_SET:
    lVar2 = (longdouble)(*args)->used;
    if ((set->type | LYXP_SET_NUMBER) == LYXP_SET_STRING) {
      free((set->val).nodes);
    }
    set->type = LYXP_SET_NUMBER;
LAB_0016e9f0:
    (set->val).num = lVar2;
    return 0;
  case LYXP_SET_SNODE_SET:
    pcVar1 = "schema node set";
    break;
  case LYXP_SET_BOOLEAN:
    pcVar1 = "boolean";
    break;
  case LYXP_SET_NUMBER:
    pcVar1 = "number";
    break;
  case LYXP_SET_STRING:
    pcVar1 = "string";
    break;
  default:
    pcVar1 = (char *)0x0;
  }
  ly_vlog(LYE_XPATH_INARGTYPE,LY_VLOG_NONE,(void *)0x0,1,pcVar1,"count(node-set)");
  return -1;
}

Assistant:

static int
xpath_count(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *UNUSED(cur_node),
            struct lys_module *UNUSED(local_mod), struct lyxp_set *set, int UNUSED(options))
{
    if (args[0]->type == LYXP_SET_EMPTY) {
        set_fill_number(set, 0);
        return EXIT_SUCCESS;
    }

    if (args[0]->type != LYXP_SET_NODE_SET) {
        LOGVAL(LYE_XPATH_INARGTYPE, LY_VLOG_NONE, NULL, 1, print_set_type(args[0]), "count(node-set)");
        return -1;
    }

    set_fill_number(set, args[0]->used);
    return EXIT_SUCCESS;
}